

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

string * __thiscall
Node::OutputPassmech_abi_cxx11_(string *__return_storage_ptr__,Node *this,int FunctionFlag)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x129) {
    pcVar1 = "& /* Descriptor */ ";
  }
  else {
    if (this->Type != 0x186) {
      return __return_storage_ptr__;
    }
    pcVar1 = "&";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputPassmech(
	int FunctionFlag	/**> Function flag */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_S_VALUE:
		break;

	case BAS_S_REF:
		result = "&";
		break;

	case BAS_S_DESC:
		result = "& /* Descriptor */ ";
		break;
	}

	return result;
}